

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPerformanceHistory::IfcPerformanceHistory(IfcPerformanceHistory *this)

{
  IfcPerformanceHistory *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x110,"IfcPerformanceHistory");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00eeed20);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPerformanceHistory,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPerformanceHistory,_1UL>,
             &PTR_construction_vtable_24__00eeedd0);
  *(undefined8 *)this = 0xeeec40;
  *(undefined8 *)&this->field_0x110 = 0xeeed08;
  *(undefined8 *)&this->field_0x88 = 0xeeec68;
  *(undefined8 *)&this->field_0x98 = 0xeeec90;
  *(undefined8 *)&this->field_0xd0 = 0xeeecb8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPerformanceHistory,_1UL>)._vptr_ObjectHelper
       = (_func_int **)0xeeece0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPerformanceHistory,_1UL>).
              field_0x10);
  return;
}

Assistant:

IfcPerformanceHistory() : Object("IfcPerformanceHistory") {}